

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

Vec_Int_t * Ssw_MatchingMiter(Aig_Man_t *pMiter,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairsAll)

{
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  Vec_Int_t *p;
  int *piVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  
  iVar11 = p0->vObjs->nSize - p0->nDeleted;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar11 * 2 - 1U) {
    iVar4 = iVar11 * 2;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar3;
  iVar4 = vPairsAll->nSize;
  if (0 < iVar4) {
    lVar8 = 1;
    do {
      pVVar1 = p0->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        uVar10 = vPairsAll->pArray[lVar8 + -1];
        if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) goto LAB_006afae6;
        pvVar5 = pVVar1->pArray[uVar10];
      }
      if (iVar4 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pVVar1 = p1->vObjs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        uVar10 = vPairsAll->pArray[lVar8];
        if (((int)uVar10 < 0) || (pVVar1->nSize <= (int)uVar10)) {
LAB_006afae6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar6 = pVVar1->pArray[uVar10];
      }
      piVar3 = *(int **)((long)pvVar5 + 0x28);
      if (piVar3 == (int *)0x0) {
        __assert_fail("pObj0->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                      ,0x17d,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      piVar2 = *(int **)((long)pvVar6 + 0x28);
      if (piVar2 == (int *)0x0) {
        __assert_fail("pObj1->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                      ,0x17e,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      if (piVar3 != piVar2) {
        uVar9 = *(ulong *)(piVar3 + 6) & 7;
        if (uVar9 != 0) {
          uVar7 = *(ulong *)(piVar2 + 6) & 7;
          if (uVar7 != 0) {
            if (((ulong)piVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                            ,0x186,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            if (((ulong)piVar2 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                            ,0x187,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            uVar10 = (uint)*(ulong *)(piVar3 + 6) & 7;
            if (uVar10 != ((uint)*(ulong *)(piVar2 + 6) & 7)) {
              __assert_fail("Aig_ObjType(pObj0) == Aig_ObjType(pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                            ,0x188,
                            "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                           );
            }
            iVar11 = (int)uVar9;
            if (iVar11 != 3) {
              if (uVar10 - 7 < 0xfffffffe) {
                if ((iVar11 != 2) || (*piVar3 < pMiter->nTruePis)) {
                  __assert_fail("Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                                ,0x18b,
                                "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                               );
                }
                if (((int)uVar7 != 2) || (*piVar2 < pMiter->nTruePis)) {
                  __assert_fail("Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                                ,0x18c,
                                "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                               );
                }
              }
              if (piVar2[9] <= piVar3[9]) {
                __assert_fail("pObj0->Id < pObj1->Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswIslands.c"
                              ,0x18d,
                              "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                             );
              }
              Vec_IntPush(p,piVar3[9]);
              Vec_IntPush(p,piVar2[9]);
              iVar4 = vPairsAll->nSize;
            }
          }
        }
      }
      iVar11 = (int)lVar8;
      lVar8 = lVar8 + 2;
    } while (iVar11 + 1 < iVar4);
  }
  return p;
}

Assistant:

Vec_Int_t * Ssw_MatchingMiter( Aig_Man_t * pMiter, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairsAll )
{
    Vec_Int_t * vPairsMiter;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching of nodes in the miter
    vPairsMiter = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    for ( i = 0; i < Vec_IntSize(vPairsAll); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairsAll, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairsAll, i+1) );
        assert( pObj0->pData != NULL );
        assert( pObj1->pData != NULL );
        if ( pObj0->pData == pObj1->pData )
            continue;
        if ( Aig_ObjIsNone((Aig_Obj_t *)pObj0->pData) || Aig_ObjIsNone((Aig_Obj_t *)pObj1->pData) )
            continue;
        // get the miter nodes
        pObj0 = (Aig_Obj_t *)pObj0->pData;
        pObj1 = (Aig_Obj_t *)pObj1->pData;
        assert( !Aig_IsComplement(pObj0) );
        assert( !Aig_IsComplement(pObj1) );
        assert( Aig_ObjType(pObj0) == Aig_ObjType(pObj1) );
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        assert( Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0) );
        assert( Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1) );
        assert( pObj0->Id < pObj1->Id );
        Vec_IntPush( vPairsMiter, pObj0->Id );
        Vec_IntPush( vPairsMiter, pObj1->Id );
    }
    return vPairsMiter;
}